

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerSelect.cpp
# Opt level: O1

void __thiscall Liby::PollerSelect::loop_once(PollerSelect *this,Timestamp *ts)

{
  long lVar1;
  Channel *pCVar2;
  int iVar3;
  Logger *this_00;
  int *piVar4;
  long lVar5;
  fd_set *pfVar6;
  timeval *ptVar7;
  fd_set *pfVar8;
  timeval *__timeout;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  byte bVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  fd_set rset;
  fd_set eset;
  fd_set wset;
  timeval local_1e8;
  _Any_data local_1d8;
  code *local_1c8;
  code *local_1c0;
  timeval local_1b8 [8];
  fd_set local_130;
  fd_set local_b0;
  
  bVar14 = 0;
  Poller::runNextLoopHandlers(&this->super_Poller);
  if (ts == (Timestamp *)0x0) {
    __timeout = (timeval *)0x0;
  }
  else {
    local_1b8[0].tv_sec = 0;
    local_1b8[0].tv_usec = 0;
    gettimeofday(local_1b8,(__timezone_ptr_t)0x0);
    lVar5 = (ts->tv_).tv_sec;
    if ((lVar5 < local_1b8[0].tv_sec) ||
       ((lVar5 - local_1b8[0].tv_sec == 0 || lVar5 < local_1b8[0].tv_sec &&
        ((ts->tv_).tv_usec < local_1b8[0].tv_usec)))) {
      local_1e8.tv_sec = 0;
      local_1e8.tv_usec = 0;
    }
    else {
      lVar1 = (ts->tv_).tv_usec;
      local_1e8.tv_usec = lVar1 + 1000000;
      if (local_1b8[0].tv_usec <= lVar1) {
        local_1e8.tv_usec = lVar1;
      }
      local_1e8.tv_sec = (lVar5 - local_1b8[0].tv_sec) - (ulong)(lVar1 < local_1b8[0].tv_usec);
      local_1e8.tv_usec = local_1e8.tv_usec - local_1b8[0].tv_usec;
      if (1000000 < (uint)local_1e8.tv_usec) {
        local_1e8.tv_sec = local_1e8.tv_sec + local_1e8.tv_usec / 1000000;
        local_1e8.tv_usec = local_1e8.tv_usec % 1000000;
      }
    }
    __timeout = &local_1e8;
  }
  pfVar6 = &this->rset_;
  ptVar7 = local_1b8;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    ptVar7->tv_sec = pfVar6->fds_bits[0];
    pfVar6 = (fd_set *)((long)pfVar6 + (ulong)bVar14 * -0x10 + 8);
    ptVar7 = (timeval *)&ptVar7[-(ulong)bVar14].tv_usec;
  }
  pfVar6 = &this->wset_;
  pfVar8 = &local_b0;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pfVar8->fds_bits[0] = pfVar6->fds_bits[0];
    pfVar6 = (fd_set *)((long)pfVar6 + (ulong)bVar14 * -0x10 + 8);
    pfVar8 = (fd_set *)((long)pfVar8 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  pfVar6 = &this->eset_;
  pfVar8 = &local_130;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pfVar8->fds_bits[0] = pfVar6->fds_bits[0];
    pfVar6 = (fd_set *)((long)pfVar6 + (ulong)bVar14 * -0x10 + 8);
    pfVar8 = (fd_set *)((long)pfVar8 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  iVar3 = select(this->maxfd_,(fd_set *)local_1b8,&local_b0,&local_130,__timeout);
  if (iVar3 == -1) {
    this_00 = Logger::getLogger();
    piVar4 = __errno_location();
    strerror(*piVar4);
    Logger::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  if (0 < iVar3 && 0 < this->maxfd_) {
    uVar11 = 0;
    do {
      local_1c0 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp:93:33)>
                  ::_M_invoke;
      local_1d8._8_8_ = 0;
      local_1c8 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp:93:33)>
                  ::_M_manager;
      pCVar2 = (this->super_Poller).channels_.
               super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11];
      local_1d8._M_unused._M_object = this;
      if (pCVar2 != (Channel *)0x0) {
        uVar10 = uVar11 >> 6 & 0x3ffffff;
        uVar12 = 1L << ((byte)uVar11 & 0x3f);
        if (((ulong)local_130.fds_bits[uVar10] >> (uVar11 & 0x3f) & 1) == 0) {
          bVar13 = ((&local_1b8[0].tv_sec)[uVar10] & uVar12) != 0;
          if (bVar13) {
            Channel::handleReadEvent(pCVar2);
          }
          uVar9 = (uint)bVar13;
          if (((local_b0.fds_bits[uVar10] & uVar12) != 0) &&
             (pCVar2 = (this->super_Poller).channels_.
                       super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar11], pCVar2 != (Channel *)0x0)) {
            uVar9 = 1;
            Channel::handleWritEvent(pCVar2);
          }
          iVar3 = iVar3 - uVar9;
        }
        else {
          Channel::handleErroEvent(pCVar2);
        }
      }
      DeferCaller::~DeferCaller((DeferCaller *)&local_1d8);
      uVar11 = uVar11 + 1;
    } while (((long)uVar11 < (long)this->maxfd_) && (0 < iVar3));
  }
  Poller::runAfterLoopHandlers(&this->super_Poller);
  return;
}

Assistant:

void PollerSelect::loop_once(Timestamp *ts) {
    runNextLoopHandlers();

    struct timeval timeout;
    struct timeval *pto = nullptr;
    if (ts != nullptr) {
        Timestamp now = Timestamp::now();
        if (*ts < now) {
            timeout = {0, 0};
        } else {
            Timestamp inter = *ts - now;
            timeout = {.tv_sec = inter.sec(), .tv_usec = inter.usec()};
        }
        pto = &timeout;
    }

    fd_set rset = rset_;
    fd_set wset = wset_;
    fd_set eset = eset_;

    int nready = ::select(maxfd_, &rset, &wset, &eset, pto);
    errorif(nready == -1, "select: %s", ::strerror(errno));

    for (int fd = 0; fd < maxfd_ && nready > 0; fd++) {
        DeferCaller deferCaller([this] { runNextTickHandlers(); });

        Channel *ch = getChannel(fd);
        if (ch == nullptr)
            continue;

        bool flag = false;
        if (FD_ISSET(fd, &eset)) {
            flag = true;
            ch->handleErroEvent();
            continue;
        }
        if (FD_ISSET(fd, &rset)) {
            flag = true;
            ch->handleReadEvent();
        }
        if (FD_ISSET(fd, &wset) && (ch = getChannel(fd)) != nullptr) {
            flag = true;
            ch->handleWritEvent();
        }

        if (flag == true) {
            nready--;
        }
    }

    runAfterLoopHandlers();
}